

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BatchnormLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_batchnorm(NeuralNetworkLayer *this)

{
  bool bVar1;
  BatchnormLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_batchnorm(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_batchnorm(this);
    this_00 = (BatchnormLayerParams *)operator_new(0x48);
    BatchnormLayerParams::BatchnormLayerParams(this_00);
    (this->layer_).batchnorm_ = this_00;
  }
  return (BatchnormLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BatchnormLayerParams* NeuralNetworkLayer::mutable_batchnorm() {
  if (!has_batchnorm()) {
    clear_layer();
    set_has_batchnorm();
    layer_.batchnorm_ = new ::CoreML::Specification::BatchnormLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.batchnorm)
  return layer_.batchnorm_;
}